

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClientTimingLog.cpp
# Opt level: O2

void __thiscall
ViconDataStreamSDK::Core::VClientTimingLog::LogLatencies
          (VClientTimingLog *this,ostream *i_rStream,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *i_rHeadings,
          vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
          *i_rLatencies)

{
  pointer pbVar1;
  pointer pVVar2;
  __type _Var3;
  EHeadingComparison EVar4;
  VClientTimingLog *this_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Heading;
  pointer __lhs;
  
  this_00 = (VClientTimingLog *)&stack0xffffffffffffffb8;
  LogHeadings_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffb8,(VClientTimingLog *)i_rStream,i_rLatencies);
  EVar4 = CompareHeadings(this_00,i_rHeadings,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffffb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffb8);
  if ((int)EVar4 < 2) {
    pbVar1 = (i_rHeadings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = 0;
    for (__lhs = (i_rHeadings->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
      pVVar2 = (i_rLatencies->
               super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar5 < (ulong)(((long)(i_rLatencies->
                                 super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x28)
         ) {
        _Var3 = std::operator==(__lhs,&pVVar2[uVar5].m_Name);
        std::operator<<(i_rStream,", ");
        if (_Var3) {
          std::ostream::_M_insert<double>
                    ((i_rLatencies->
                     super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar5].m_Latency);
          uVar5 = (ulong)((int)uVar5 + 1);
        }
      }
      else {
        std::operator<<(i_rStream,", ");
      }
    }
  }
  return;
}

Assistant:

void VClientTimingLog::LogLatencies(std::ostream & i_rStream, const std::vector< std::string > & i_rHeadings, const std::vector< ViconCGStreamDetail::VLatencyInfo_Sample >& i_rLatencies) const
{
  EHeadingComparison Result = CompareHeadings( i_rHeadings, LogHeadings( i_rLatencies ) );
  if( Result <= ESubset )
  { 
    unsigned int LatencyIndex = 0;
    for( const auto& Heading : i_rHeadings)
    {
      if(LatencyIndex < i_rLatencies.size() )
      {
        if( Heading == i_rLatencies[ LatencyIndex ].m_Name )
        { 
          i_rStream << ", " << i_rLatencies[ LatencyIndex ].m_Latency;
          ++LatencyIndex;
        }
        else
        {
          i_rStream << ", ";
        }
      }
      else
      {
        i_rStream << ", ";
      }
    }
  }
  // We need a DSSDK error log
  //else
  //{
  //  i_rStream << ", Headings are " << ( Result == ESuperset ) ? "Superset, " : "Different, ";
  //  for (const auto& rHeading : LogHeadings(i_rLatencies))
  //  {
  //    i_rStream << rHeading << ", ";
  //  }
  //}
}